

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp-rcnb-cli.cc
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  _Ios_Openmode _Var4;
  char *pcVar5;
  encoder *this;
  locale *this_00;
  ostream *poVar6;
  long in_RSI;
  int in_EDI;
  encoder E;
  locale utf8_locale_1;
  wofstream outstream_1;
  ifstream instream_1;
  decoder D;
  ofstream outstream;
  locale utf8_locale;
  wifstream instream;
  string choice;
  string output;
  string input;
  char *in_stack_fffffffffffff528;
  allocator *paVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff530;
  size_t in_stack_fffffffffffff538;
  codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0> *in_stack_fffffffffffff540;
  codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0> *in_stack_fffffffffffff550;
  undefined7 in_stack_fffffffffffff558;
  undefined1 in_stack_fffffffffffff55f;
  locale *in_stack_fffffffffffff560;
  wostream *in_stack_fffffffffffff570;
  undefined7 in_stack_fffffffffffff578;
  undefined1 in_stack_fffffffffffff57f;
  decoder *in_stack_fffffffffffff580;
  allocator local_9e9;
  string local_9e8 [32];
  encoder local_9c8;
  locale local_9c0;
  locale local_9b8;
  locale local_9b0;
  allocator local_9a1;
  string local_9a0 [32];
  undefined1 local_980 [519];
  allocator local_779;
  string local_778 [32];
  undefined1 local_758 [520];
  decoder local_550;
  allocator local_529;
  string local_528 [32];
  undefined1 local_508 [512];
  locale local_308;
  locale local_300;
  locale local_2f8;
  allocator local_2e9;
  string local_2e8 [32];
  undefined1 local_2c8 [527];
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  long local_10;
  int local_4;
  
  local_4 = 0;
  if (in_EDI == 1) {
    usage();
    exit(-1);
  }
  if (in_EDI != 4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"Wrong number of arguments!",&local_31);
    usage((string *)0x103568);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    exit(-1);
  }
  pcVar5 = *(char **)(in_RSI + 0x10);
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,pcVar5,&local_69);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  pcVar5 = *(char **)(local_10 + 0x18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,pcVar5,&local_91);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  pcVar5 = *(char **)(local_10 + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,pcVar5,&local_b9);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  bVar1 = std::operator==(in_stack_fffffffffffff530,in_stack_fffffffffffff528);
  if (bVar1) {
    pcVar5 = (char *)std::__cxx11::string::c_str();
    _Var4 = std::operator|(_S_in,_S_bin);
    std::wifstream::wifstream(local_2c8,pcVar5,_Var4);
    bVar2 = std::wifstream::is_open();
    if ((bVar2 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2e8,"Could not open input file!",&local_2e9);
      usage((string *)0x1037b5);
      std::__cxx11::string::~string(local_2e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
      exit(-1);
    }
    std::locale::locale(&local_300);
    operator_new(0x28);
    std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>::codecvt_utf8
              (in_stack_fffffffffffff540,in_stack_fffffffffffff538);
    std::locale::locale<std::codecvt_utf8<wchar_t,1114111ul,(std::codecvt_mode)0>>
              (in_stack_fffffffffffff560,
               (locale *)CONCAT17(in_stack_fffffffffffff55f,in_stack_fffffffffffff558),
               in_stack_fffffffffffff550);
    std::locale::~locale(&local_300);
    std::wios::imbue(&local_308);
    std::locale::~locale(&local_308);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    _Var4 = std::operator|(_S_out,_S_bin);
    std::ofstream::ofstream(local_508,pcVar5,_Var4);
    bVar2 = std::ofstream::is_open();
    if ((bVar2 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_528,"Could not open output file!",&local_529);
      usage((string *)0x103a00);
      std::__cxx11::string::~string(local_528);
      std::allocator<char>::~allocator((allocator<char> *)&local_529);
      exit(-1);
    }
    rcnb::decoder::decoder(&local_550,0x1000);
    rcnb::decoder::decode
              (in_stack_fffffffffffff580,
               (wistream *)CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578),
               (ostream *)in_stack_fffffffffffff570);
    std::ofstream::~ofstream(local_508);
    std::locale::~locale(&local_2f8);
    std::wifstream::~wifstream(local_2c8);
  }
  else {
    bVar1 = std::operator==(in_stack_fffffffffffff530,in_stack_fffffffffffff528);
    if (bVar1) {
      this = (encoder *)std::__cxx11::string::c_str();
      _Var4 = std::operator|(_S_in,_S_bin);
      std::ifstream::ifstream(local_758,(char *)this,_Var4);
      bVar2 = std::ifstream::is_open();
      if ((bVar2 & 1) == 0) {
        paVar7 = &local_779;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_778,"Could not open input file!",paVar7);
        usage((string *)0x103c33);
        std::__cxx11::string::~string(local_778);
        std::allocator<char>::~allocator((allocator<char> *)&local_779);
        exit(-1);
      }
      this_00 = (locale *)std::__cxx11::string::c_str();
      _Var4 = std::operator|(_S_out,_S_bin);
      std::wofstream::wofstream(local_980,(char *)this_00,_Var4);
      bVar3 = std::wofstream::is_open();
      if ((bVar3 & 1) == 0) {
        paVar7 = &local_9a1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_9a0,"Could not open output file!",paVar7);
        usage((string *)0x103d55);
        std::__cxx11::string::~string(local_9a0);
        std::allocator<char>::~allocator((allocator<char> *)&local_9a1);
        exit(-1);
      }
      std::locale::locale(&local_9b8);
      operator_new(0x28);
      std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>::codecvt_utf8
                (in_stack_fffffffffffff540,in_stack_fffffffffffff538);
      std::locale::locale<std::codecvt_utf8<wchar_t,1114111ul,(std::codecvt_mode)0>>
                (this_00,(locale *)CONCAT17(bVar3,in_stack_fffffffffffff558),
                 in_stack_fffffffffffff550);
      std::locale::~locale(&local_9b8);
      std::wios::imbue(&local_9c0);
      std::locale::~locale(&local_9c0);
      rcnb::encoder::encoder(&local_9c8,0x1000);
      rcnb::encoder::encode
                (this,(istream *)CONCAT17(bVar2,in_stack_fffffffffffff578),in_stack_fffffffffffff570
                );
      std::locale::~locale(&local_9b0);
      std::wofstream::~wofstream(local_980);
      std::ifstream::~ifstream(local_758);
    }
    else {
      poVar6 = std::operator<<((ostream *)&std::cout,"[");
      poVar6 = std::operator<<(poVar6,local_b8);
      poVar6 = std::operator<<(poVar6,"]");
      std::ostream::operator<<((ostream *)poVar6,std::endl<char,std::char_traits<char>>);
      paVar7 = &local_9e9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_9e8,"Please specify -d or -e as first argument!",paVar7);
      usage((string *)0x103fe4);
      std::__cxx11::string::~string(local_9e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_9e9);
    }
  }
  local_4 = 0;
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_68);
  return local_4;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc == 1)
    {
        usage();
        exit(-1);
    }
    if (argc != 4)
    {
        usage("Wrong number of arguments!");
        exit(-1);
    }

    std::string input = argv[2];
    std::string output = argv[3];

    // determine whether we need to encode or decode:
    std::string choice = argv[1];
    if (choice == "-d")
    {
        std::wifstream instream(input.c_str(), std::ios_base::in | std::ios_base::binary);
        if (!instream.is_open())
        {
            usage("Could not open input file!");
            exit(-1);
        }
        std::locale utf8_locale(std::locale(), new std::codecvt_utf8<wchar_t>);
        instream.imbue(utf8_locale);

        std::ofstream outstream(output.c_str(), std::ios_base::out | std::ios_base::binary);
        if (!outstream.is_open())
        {
            usage("Could not open output file!");
            exit(-1);
        }
        rcnb::decoder D;
        D.decode(instream, outstream);
    }
    else if (choice == "-e")
    {
        std::ifstream instream(input.c_str(), std::ios_base::in | std::ios_base::binary);
        if (!instream.is_open())
        {
            usage("Could not open input file!");
            exit(-1);
        }

        std::wofstream outstream(output.c_str(), std::ios_base::out | std::ios_base::binary);
        if (!outstream.is_open())
        {
            usage("Could not open output file!");
            exit(-1);
        }
        std::locale utf8_locale(std::locale(), new std::codecvt_utf8<wchar_t>);
        outstream.imbue(utf8_locale);
        rcnb::encoder E;
        E.encode(instream, outstream);
    }
    else
    {
        std::cout<<"["<<choice<<"]"<<std::endl;
        usage("Please specify -d or -e as first argument!");
    }

    return 0;
}